

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_sys.c
# Opt level: O0

c_int load_linsys_solver(linsys_solver_type linsys_solver)

{
  int in_EDI;
  char *in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  if (in_EDI == 0) {
    local_8 = 0;
  }
  else if (in_EDI == 1) {
    local_8 = lh_load_pardiso(in_stack_ffffffffffffffe8);
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

c_int load_linsys_solver(enum linsys_solver_type linsys_solver) {
  switch (linsys_solver) {
  case QDLDL_SOLVER:

    // We do not load  QDLDL solver. We have the source.
    return 0;

# ifdef ENABLE_MKL_PARDISO
  case MKL_PARDISO_SOLVER:

    // Load Pardiso library
    return lh_load_pardiso(OSQP_NULL);

# endif /* ifdef ENABLE_MKL_PARDISO */
  default: // QDLDL
    return 0;
  }
}